

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::anon_unknown_0::AtomicMachine::GenShader<int>
          (string *__return_storage_ptr__,AtomicMachine *this,int stage,GLenum internalformat)

{
  ostream *poVar1;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream os;
  GLenum internalformat_local;
  int stage_local;
  AtomicMachine *this_local;
  
  os._368_4_ = internalformat;
  os._372_4_ = stage;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"#version 420 core");
  if (os._372_4_ == 4) {
    std::operator<<((ostream *)local_198,"\n#extension GL_ARB_compute_shader : require");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1c8,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_1e8,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_208,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_228,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_228);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_248,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_248);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_268,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_268);
  poVar1 = std::operator<<(poVar1,"image2DRect g_image_2drect;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_288,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_288);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_2a8,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a8);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2c8,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c8);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_2e8,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_2e8);
  poVar1 = std::operator<<(poVar1,"imageBuffer g_image_buffer;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_308,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_308);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_328,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_328);
  poVar1 = std::operator<<(poVar1,"image1DArray g_image_1darray;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_348,(ShaderImageLoadStoreBase *)this,os._368_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_348);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<int>(&local_368,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_368);
  std::operator<<(poVar1,
                  "image2DArray g_image_2darray;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform int g_value[6] = int[](0, 1, 2, 3, 4, 5);"
                 );
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (os._372_4_ == 0) {
    std::operator<<((ostream *)local_198,
                    "\nvoid main() {\n  ivec2 coord = ivec2(gl_VertexID, g_value[0]);");
  }
  else if (os._372_4_ == 1) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(vertices = 1) out;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);"
                   );
  }
  else if (os._372_4_ == 2) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(quads, point_mode) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);"
                   );
  }
  else if (os._372_4_ == 3) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main() {\n  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_value[0]);"
                   );
  }
  else if (os._372_4_ == 4) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);"
                   );
  }
  std::operator<<((ostream *)local_198,
                  "\n  vec4 o_color = vec4(0, 1, 0, 1);\n  imageAtomicExchange(g_image_2d, coord, 0);\n  if (imageAtomicAdd(g_image_2d, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2d, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_2d, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_2d, coord, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_2d, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_2d, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2d, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_2d, coord, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2d, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0);\n  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  imageAtomicExchange(g_image_2drect, coord, 0);\n  if (imageAtomicAdd(g_image_2drect, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2drect, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g..." /* TRUNCATED STRING LITERAL */
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage, GLenum internalformat)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform "
		   << TypePrefix<T>() << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") coherent uniform " << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout("
		   << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform "
		   << TypePrefix<T>() << "imageBuffer g_image_buffer;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") coherent uniform " << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "layout(rgba32f) writeonly uniform image2D g_image_result;" NL
			  "uniform int g_value[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_value[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_value[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_value[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);";
		}
		os << NL
			"  vec4 o_color = vec4(0, 1, 0, 1);" NL "  imageAtomicExchange(g_image_2d, coord, 0);" NL
			"  if (imageAtomicAdd(g_image_2d, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2d, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2d, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2d, coord, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2d, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2d, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2d, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_2d, coord, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2d, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_2drect, coord, 0);" NL
			"  if (imageAtomicAdd(g_image_2drect, coord, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2drect, coord, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2drect, coord, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2drect, coord, 0) != g_value[4]) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2drect, coord, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2drect, coord, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2drect, coord, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_2drect, coord, g_value[1], 6) != 1) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicExchange(g_image_2drect, coord, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_cube, ivec3(coord, 0), 0);" NL "  if (imageAtomicAdd(g_image_cube, "
			"ivec3(coord, 0), g_value[2]) != 0) "
			"o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_cube, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_cube, ivec3(coord, 0), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_cube, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_cube, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_cube, ivec3(coord, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicCompSwap(g_image_cube, ivec3(coord, g_value[0]), 1, 6) != 1) o_color = vec4(1.0, 0.0, "
			"0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_buffer, coord.x, g_value[0]);" NL
			"  if (imageAtomicAdd(g_image_buffer, coord.x, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_buffer, coord.x, g_value[3]) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_buffer, coord.x, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_buffer, coord.x, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_buffer, coord.x, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_buffer, coord.x, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_buffer, coord.x, g_value[1]) != 3) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL
			"  if (imageAtomicCompSwap(g_image_buffer, coord.x, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_buffer, coord.x, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_1darray, ivec2(coord.x, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_1darray, ivec2(coord.x, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_1darray, ivec2(coord.x, g_value[0]), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL
			"  if (imageAtomicAnd(g_image_1darray, ivec2(coord.x, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_1darray, ivec2(coord.x, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_1darray, ivec2(coord.x, 0), 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 1) != 3) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicCompSwap(g_image_1darray, ivec2(coord.x, 0), 1, 6) != 1) o_color = vec4(1.0, "
			"0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_1darray, ivec2(coord.x, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 0);" NL
			"  if (imageAtomicAdd(g_image_2darray, ivec3(coord, 0), 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMin(g_image_2darray, ivec3(coord, 0), 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicMax(g_image_2darray, ivec3(coord, 0), 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicAnd(g_image_2darray, ivec3(coord, 0), 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicOr(g_image_2darray, ivec3(coord, 0), 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicXor(g_image_2darray, ivec3(coord, 0), g_value[4]) != 7) o_color = vec4(1.0, 0.0, 0.0, "
			"1.0);" NL "  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 1) != 3) o_color = vec4(1.0, 0.0, "
			"0.0, 1.0);" NL "  if (imageAtomicCompSwap(g_image_2darray, ivec3(coord, 0), 1, 6) != 1) "
			"o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);"

			NL "  imageStore(g_image_result, coord, o_color);" NL "}";
		return os.str();
	}